

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtIO.c
# Opt level: O2

newtRef NewtFgets(FILE *stream)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  newtRefArg r;
  newtRef nVar6;
  uint32_t len;
  char buff [2048];
  
  r = 2;
  do {
    __s = fgets(buff,0x800,(FILE *)stream);
    if (__s == (char *)0x0) {
      return r;
    }
    sVar5 = strlen(__s);
    len = (uint32_t)sVar5;
    if (r == 2) {
      r = NewtMakeString2(__s,len,false);
      _Var1 = NewtRefIsNIL(r);
      if (_Var1) {
LAB_00106e48:
        nVar6 = NewtThrow0(-0xbc58);
        return nVar6;
      }
    }
    else {
      uVar2 = NewtStringLength(r);
      r = NewtStrCat2(r,__s,(long)(int)len);
      uVar3 = NewtStringLength(r);
      if (uVar3 < uVar2 + len) goto LAB_00106e48;
    }
    if ((int)len < 0x7ff) {
      return r;
    }
    if (buff[0x7fe] == '\r') {
      iVar4 = fgetc((FILE *)stream);
      if (iVar4 << 0x18 != 0xa000000) {
        ungetc((iVar4 << 0x18) >> 0x18,(FILE *)stream);
        return r;
      }
    }
    else if (buff[0x7fe] == '\n') {
      return r;
    }
  } while( true );
}

Assistant:

newtRef NewtFgets(FILE * stream)
{
    newtRefVar  result = kNewtRefNIL;
    char	buff[NEWT_FGETS_BUFFSIZE];
    char *  str;
    char	c;
    int		maxsize;
    int		oldlen;
    int		len;
    
    maxsize = sizeof(buff) - 1;
    
    while ((str = fgets(buff, sizeof(buff), stream)) != NULL)
    {
        len = (int)strlen(str);
        
        if (result == kNewtRefNIL)
        {	// 文字列オブジェクト作成
            result = NewtMakeString2(str, len, false);
            
            if (NewtRefIsNIL(result))
            {	// メモリを確保できなかった
                return NewtThrow0(kNErrOutOfObjectMemory);
            }
        }
        else
        {	// 追加
            oldlen = NewtStringLength(result);
            result = NewtStrCat2(result, str, len);
            
            if (NewtStringLength(result) < oldlen + len)
            {	// メモリを確保できなかった
                return NewtThrow0(kNErrOutOfObjectMemory);
            }
        }
        
        if (len < maxsize)
            break;
        
        // 最後の文字をチェック
        c = buff[maxsize - 1];
        
        if (c == '\n')
            break;
        
        if (c == '\r')
        {
            // １文字先読み
            c = fgetc(stream);
            
            if (c != '\n')
            {	// CRLF でない（CR のみ）場合
                // 先読みした文字をストリームに戻す
                ungetc(c, stream);
                break;
            }
        }
    }
    
    return result;
}